

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O3

int node::
    index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              (TreeIndexAll *ti,Node<label::StringLabel> *n,LabelDictionary<label::StringLabel> *ld,
              UnitCostModelLD<label::StringLabel> *cm,int *start_preorder,int *start_postorder,
              int start_depth,int *subtree_max_depth,int start_height,int *height,
              int parent_preorder,bool is_rightmost_child)

{
  Node<label::StringLabel> *pNVar1;
  ulong *puVar2;
  int parent_preorder_00;
  iterator iVar3;
  pointer pvVar4;
  pointer pNVar5;
  pointer pNVar6;
  pointer plVar7;
  pointer pdVar8;
  pointer pdVar9;
  int iVar10;
  ulong uVar11;
  pointer piVar12;
  vector<int,std::allocator<int>> *pvVar13;
  undefined8 uVar14;
  int iVar15;
  pointer piVar16;
  long lVar17;
  Node<label::StringLabel> *n_00;
  ulong uVar18;
  pointer plVar19;
  pointer plVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  bool is_rightmost_child_00;
  long lVar25;
  int iVar26;
  int local_128;
  int local_124;
  int subtree_size_child;
  int this_subtree_max_depth;
  vector<int,_std::allocator<int>_> children_subtree_deletion_costs;
  int local_f0;
  uint local_ec;
  int label_id;
  vector<int,_std::allocator<int>_> children_sorted_subtree_size;
  vector<int,_std::allocator<int>_> children_postorders;
  vector<int,_std::allocator<int>_> children_preorders;
  int local_64;
  int *local_60;
  Node<label::StringLabel> *local_58;
  ListKR *local_50;
  ulong local_48;
  LabelDictionary<label::StringLabel> *local_40;
  UnitCostModelLD<label::StringLabel> *local_38;
  
  local_40 = ld;
  local_38 = cm;
  label_id = label::LabelDictionary<label::StringLabel>::insert(ld,&n->label_);
  parent_preorder_00 = *start_preorder;
  *start_preorder = parent_preorder_00 + 1;
  children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((int)((ulong)((long)(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 <=
      start_depth) {
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&ti->super_InvertedListDepthToPostL,&children_subtree_deletion_costs);
    if (children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)children_subtree_deletion_costs.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)children_subtree_deletion_costs.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  this_subtree_max_depth = 0;
  subtree_size_child = -1;
  n_00 = (n->children_).
         super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (n->children_).
             super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (n_00 == local_58) {
    iVar23 = *start_postorder;
    local_f0 = -1;
    iVar21 = 0;
    local_128 = -1;
    local_124 = -1;
    local_ec = 0;
    iVar15 = 0;
  }
  else {
    local_48 = (ulong)(start_depth + 1);
    local_50 = &ti->super_ListKR;
    iVar26 = -1;
    iVar15 = 0;
    local_ec = 0;
    local_124 = -1;
    local_128 = -1;
    iVar22 = -1;
    local_f0 = -1;
    is_rightmost_child_00 = false;
    iVar21 = 0;
    local_60 = start_preorder;
    do {
      if (children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&children_preorders,
                   (iterator)
                   children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_60);
        iVar23 = *local_60;
      }
      else {
        iVar23 = *local_60;
        *children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = iVar23;
        children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pNVar1 = n_00 + 1;
      is_rightmost_child_00 = (bool)(is_rightmost_child_00 | pNVar1 == local_58);
      (ti->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>._M_impl
      .super__Vector_impl_data._M_start[iVar23] = parent_preorder_00;
      iVar10 = index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                         (ti,n_00,local_40,local_38,local_60,start_postorder,(int)local_48,
                          &this_subtree_max_depth,start_height,height,parent_preorder_00,
                          is_rightmost_child_00);
      children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(children_subtree_deletion_costs.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,*start_postorder + -1);
      subtree_size_child = iVar10;
      if (children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&children_postorders,
                   (iterator)
                   children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&children_subtree_deletion_costs);
      }
      else {
        *children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = *start_postorder + -1;
        children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (iVar22 < subtree_size_child) {
        local_128 = *start_postorder + -1;
        local_124 = iVar26;
        iVar22 = subtree_size_child;
      }
      if (iVar21 < *height) {
        iVar21 = *height;
      }
      (ti->super_PostLToLeftSibling).postl_to_left_sibling_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(long)*start_postorder + -1] = iVar26;
      if (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&children_sorted_subtree_size,
                   (iterator)
                   children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&subtree_size_child);
      }
      else {
        *children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = subtree_size_child;
        children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (n_00 == (n->children_).
                  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
        iVar23 = *start_postorder;
        iVar26 = iVar23 + -1;
        local_f0 = iVar26;
      }
      else {
        children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(children_subtree_deletion_costs.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,*start_postorder + -1);
        iVar3._M_current =
             (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_50->list_kr_,iVar3,(int *)&children_subtree_deletion_costs);
        }
        else {
          *iVar3._M_current = *start_postorder + -1;
          (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        iVar23 = *start_postorder;
        iVar26 = iVar23 + -1;
      }
      iVar15 = iVar15 + iVar10;
      local_ec = local_ec + 1;
      n_00 = pNVar1;
    } while (pNVar1 != local_58);
  }
  piVar12 = children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  piVar16 = children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar26 = (ti->super_Constants).tree_size_;
  (ti->super_PostLToFavChild).postl_to_fav_child_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[iVar23] = local_128;
  (ti->super_PostLToFavChild).postl_to_left_fav_child_.super__Vector_base<int,_std::allocator<int>_>
  ._M_impl.super__Vector_impl_data._M_start[*start_postorder] = local_124;
  if (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    uVar11 = (long)children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    lVar24 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar24 == 0; lVar24 = lVar24 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar16,piVar12);
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      piVar16 = children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if ((int)((ulong)((long)children_subtree_deletion_costs.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)children_subtree_deletion_costs.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) == 0) {
          if (children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = *piVar16;
            goto LAB_0010715f;
          }
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&children_subtree_deletion_costs,
                     (iterator)
                     children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,piVar16);
        }
        else {
          local_64 = *piVar16 +
                     *(int *)((long)children_subtree_deletion_costs.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                             (((long)children_subtree_deletion_costs.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)children_subtree_deletion_costs.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >>
                             0x1e));
          if (children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&children_subtree_deletion_costs,
                       (iterator)
                       children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_64);
          }
          else {
            *children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_64;
LAB_0010715f:
            children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        piVar16 = piVar16 + 1;
      } while (piVar16 !=
               children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((ti->super_PostLToOrderedChildSize).postl_to_ordered_child_size_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *start_postorder,
             &children_subtree_deletion_costs);
  lVar24 = (long)iVar26 + -1;
  lVar25 = lVar24 - iVar23;
  if (children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)children_subtree_deletion_costs.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)children_subtree_deletion_costs.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar23 = (int)lVar24 - parent_preorder_00;
  *height = iVar21 + 1;
  (ti->super_PostLToHeight).postl_to_height_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*start_postorder] = iVar21 + 1;
  iVar26 = iVar15 + 1;
  (ti->super_PostLToSize).postl_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*start_postorder] = iVar26;
  (ti->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[parent_preorder_00] = iVar26;
  if (children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    piVar16 = (ti->super_PostLToParent).postl_to_parent_.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    iVar22 = *start_postorder;
    piVar12 = children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      piVar16[*piVar12] = iVar22;
      piVar12 = piVar12 + 1;
    } while (piVar12 !=
             children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  (ti->super_PostLToPreL).postl_to_prel_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*start_postorder] = parent_preorder_00;
  (ti->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[parent_preorder_00] = *start_postorder;
  (ti->super_PreLToPreR).prel_to_prer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[parent_preorder_00] = (int)lVar25;
  (ti->super_PreRToPreL).prer_to_prel_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar25] = parent_preorder_00;
  (ti->super_PreLToPostR).prel_to_postr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[parent_preorder_00] = iVar23;
  (ti->super_PostRToPreL).postr_to_prel_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar23] = parent_preorder_00;
  std::vector<int,_std::allocator<int>_>::operator=
            ((ti->super_PostLToChildren).postl_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *start_postorder,&children_postorders);
  std::vector<int,_std::allocator<int>_>::operator=
            ((ti->super_PreLToChildren).prel_to_children_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + parent_preorder_00,&children_preorders);
  (ti->super_PreLToLabelId).prel_to_label_id_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[parent_preorder_00] = label_id;
  (ti->super_PostLToLabelId).postl_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[*start_postorder] = label_id;
  (ti->super_PostLToType).postl_to_type_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*start_postorder] = 0;
  pvVar13 = (vector<int,std::allocator<int>> *)
            std::__detail::
            _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&ti->super_InvertedListLabelIdToPostL,&label_id);
  iVar3._M_current = *(int **)(pvVar13 + 8);
  if (iVar3._M_current == *(int **)(pvVar13 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (pvVar13,iVar3,start_postorder);
  }
  else {
    *iVar3._M_current = *start_postorder;
    *(int **)(pvVar13 + 8) = iVar3._M_current + 1;
  }
  (ti->super_PostRToLabelId).postr_to_label_id_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start[iVar23] = label_id;
  (ti->super_PostLToDepth).postl_to_depth_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[*start_postorder] = start_depth;
  uVar18 = (ulong)start_depth;
  pvVar4 = (ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
           -0x5555555555555555;
  if (uVar18 <= uVar11 && uVar11 - uVar18 != 0) {
    pvVar13 = (vector<int,std::allocator<int>> *)(pvVar4 + uVar18);
    iVar3._M_current = *(int **)(pvVar13 + 8);
    if (iVar3._M_current == *(int **)(pvVar13 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (pvVar13,iVar3,start_postorder);
    }
    else {
      *iVar3._M_current = *start_postorder;
      *(int **)(pvVar13 + 8) = iVar3._M_current + 1;
    }
    pNVar5 = (n->children_).
             super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar6 = (n->children_).
             super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar6 == pNVar5) {
      this_subtree_max_depth = start_depth;
      iVar21 = start_height;
    }
    (ti->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [*start_postorder] = this_subtree_max_depth;
    iVar23 = this_subtree_max_depth;
    if (this_subtree_max_depth < *subtree_max_depth) {
      iVar23 = *subtree_max_depth;
    }
    *subtree_max_depth = iVar23;
    (ti->super_PostLToHeight).postl_to_height_.super__Vector_base<int,_std::allocator<int>_>._M_impl
    .super__Vector_impl_data._M_start[*start_postorder] = iVar21;
    if (iVar21 < *height) {
      iVar21 = *height;
    }
    *height = iVar21;
    (ti->super_PostLToLCh).postl_to_lch_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[*start_postorder] = local_f0;
    if (pNVar6 == pNVar5) {
      (ti->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[*start_postorder] = *start_postorder;
      piVar16 = (ti->super_PreLToLLD).prel_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar23 = parent_preorder_00;
    }
    else {
      piVar16 = (ti->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      piVar16[*start_postorder] = piVar16[local_f0];
      piVar16 = (ti->super_PreLToLLD).prel_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar23 = piVar16[(long)parent_preorder_00 + 1];
    }
    piVar16[parent_preorder_00] = iVar23;
    (ti->super_PreLToRLD).prel_to_rld_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[parent_preorder_00] = iVar15 + parent_preorder_00;
    if (local_ec != 0) {
      iVar23 = *children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar21 = iVar23 + 0x3f;
      if (-1 < (long)iVar23) {
        iVar21 = iVar23;
      }
      puVar2 = (ulong *)((long)(iVar21 >> 6) * 8 +
                         (long)(ti->super_PreLToTypeLeft).prel_to_type_left_.
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8
                        + (ulong)(((long)iVar23 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar2 = *puVar2 | 1L << ((byte)iVar23 & 0x3f);
      iVar23 = children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(ulong)local_ec - 1];
      iVar21 = iVar23 + 0x3f;
      if (-1 < (long)iVar23) {
        iVar21 = iVar23;
      }
      puVar2 = (ulong *)((long)(iVar21 >> 6) * 8 +
                         (long)(ti->super_PreLToTypeRight).prel_to_type_right_.
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8
                        + (ulong)(((long)iVar23 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar2 = *puVar2 | 1L << ((byte)iVar23 & 0x3f);
    }
    lVar17 = (long)iVar26;
    plVar7 = (ti->super_PreLToSpfCost).prel_to_cost_all_.
             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = plVar7[parent_preorder_00];
    plVar7[parent_preorder_00] = lVar24 + lVar17;
    lVar25 = (long)parent_preorder;
    if (parent_preorder == -1) {
      plVar19 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
                super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar20 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
                super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    else {
      plVar7[lVar25] = plVar7[lVar25] + lVar24 + lVar17;
      plVar19 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
                super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar19[lVar25] = plVar19[lVar25] + plVar19[parent_preorder_00];
      plVar20 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
                super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar20[lVar25] = plVar20[lVar25] + plVar20[parent_preorder_00];
      if (parent_preorder_00 != parent_preorder + 1) {
        plVar19[lVar25] = plVar19[lVar25] + lVar17;
      }
      if (!is_rightmost_child) {
        plVar20[lVar25] = plVar20[lVar25] + lVar17;
      }
    }
    plVar7[parent_preorder_00] = (long)(((iVar15 + 4) * iVar26) / 2) - plVar7[parent_preorder_00];
    plVar19[parent_preorder_00] = plVar19[parent_preorder_00] + lVar17;
    plVar20[parent_preorder_00] = plVar20[parent_preorder_00] + lVar17;
    pdVar8 = (ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar8[parent_preorder_00] = pdVar8[parent_preorder_00] + 1.0;
    pdVar9 = (ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar9[parent_preorder_00] = pdVar9[parent_preorder_00] + 1.0;
    if (parent_preorder != -1) {
      pdVar8[lVar25] = pdVar8[parent_preorder_00] + pdVar8[lVar25];
      pdVar9[lVar25] = pdVar9[parent_preorder_00] + pdVar9[lVar25];
    }
    *start_postorder = *start_postorder + 1;
    if (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)children_sorted_subtree_size.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)children_sorted_subtree_size.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)children_postorders.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)children_postorders.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return iVar26;
  }
  uVar14 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)children_subtree_deletion_costs.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)children_subtree_deletion_costs.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)children_postorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar14);
}

Assistant:

int index_tree_recursion(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm,
    int& start_preorder, int& start_postorder,
    int start_depth, int& subtree_max_depth,
    int start_height, int& height,
    int parent_preorder, bool is_rightmost_child) {
  
  // Stores number of descendants of this node. Incrementally computed while
  // traversing the children.
  int desc_sum = 0;

  // Stores the current node's label id.
  int label_id = ld.insert(n.label());

  // Stores the current node's type.
  int type = n.label().get_type();

  // Here, start_preorder holds this node's preorder id.
  
  int preorder_r = 0;
  int postorder_r = 0;

  // This node's preorder id.
  int this_nodes_preorder = start_preorder;

  // Increment start_preorder to hold the correct id of the consecutive node
  // in preorder.
  ++start_preorder;
  
  // To store postorder ids of this node's children.
  std::vector<int> children_postorders;
  // To store preorder ids of this node's children.
  std::vector<int> children_preorders;
  // Store the height of all children.
  std::vector<int> children_sorted_subtree_size;

  // InvertedListDepthToPostL index
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    // Add a vector for depth=start_depth in depth inverted list.
    // NOTE: `inverted_list_depth_to_postl_.size()`` returns an `unsigned int`.
    //       If `inverted_list_depth_to_postl_.size = 0`, then
    //       substracting 1 causes incorrect validation of the condition.
    if (static_cast<int>(ti.inverted_list_depth_to_postl_.size()) < (start_depth + 1)) {
      ti.inverted_list_depth_to_postl_.push_back(std::vector<int>());
    }
  }
  
  // This node's subtree max depth.
  int this_subtree_max_depth = 0;
  // This node's height.
  int this_height = 0;

  // To store if the current child in the loop is rightmost.
  bool is_current_child_rightmost = false;

  // Treat the first child separately (non-key-root, updates parent's lld).
  int first_child_postorder = -1;
  // Number of nodes of children subtrees.
  int subtree_size_child = -1;
  // Number of nodes of the child with the largest subtree.
  int largest_subtree_size_child = -1;
  // Postorder number of the favorable child.
  int favorable_child = -1;
  // Postorder number of the left sibling of the favorable child.
  int left_fav_child = -1;
  // Postorder number of the previous child.
  int previous_child_po = -1;
  // Count number of children.
  int num_children = 0;
  // Recursions to childen nodes.
  auto children_start_it = std::begin(n.get_children());
  auto children_end_it = std::end(n.get_children());

  while (children_start_it != children_end_it) {
    // Add the preoder of the current child to children_preorders.
    children_preorders.push_back(start_preorder);

    // Check if this child is rightmost.
    if(std::next(children_start_it) == children_end_it) {
      is_current_child_rightmost = true;
    }

    // PreLToParent index
    if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
      ti.prel_to_parent_[start_preorder] = this_nodes_preorder;
    }
    
    subtree_size_child = index_tree_recursion(ti, *children_start_it, ld, cm,
        start_preorder, start_postorder, start_depth + 1,
        this_subtree_max_depth, start_height, height,
        this_nodes_preorder, is_current_child_rightmost);
    desc_sum += subtree_size_child;
    
    // Add the postorder of the current child to children_postorders.
    children_postorders.push_back(start_postorder-1);
    
    // PostLToFavChild index
    if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
      if (subtree_size_child > largest_subtree_size_child) {
        largest_subtree_size_child = subtree_size_child;
        left_fav_child = previous_child_po;
        favorable_child = start_postorder-1;
      }
    }

    // PostLToHeight index
    if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
      if (height > this_height) {
        this_height = height;
      }
    }

    // PostLToLeftSibling index
    if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
      ti.postl_to_left_sibling_[start_postorder-1] = previous_child_po;
    }
    
    if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
      children_sorted_subtree_size.push_back(subtree_size_child);
    }

    // Treat the first child separately.
    if (children_start_it == n.get_children().begin()) {
      // Here, start_postorder-1 is the postorder of the current child.
      // Set this node's lld to its first child's lld.
      first_child_postorder = start_postorder-1;
    } else {
      if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
        // Add current child to kr.
        ti.list_kr_.push_back(start_postorder-1);
      }
    }
    
    ++num_children;

    previous_child_po = start_postorder-1;
    
    // Continue to consecutive children.
    ++children_start_it;
  }

  // Here, start_postorder holds this node's postorder id.
  
  // Calculate right-to-left preorder.
  preorder_r = ti.tree_size_ - 1 - start_postorder;
  
  // Calculate right-to-left postorder.
  postorder_r = ti.tree_size_ - 1 - this_nodes_preorder;
  
  // PostLToFavChild index
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_[start_postorder] = favorable_child;
    ti.postl_to_left_fav_child_[start_postorder] = left_fav_child;
  }

  // PostLToOrderedChildSize
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    // Sort all children by subtree size.
    std::sort (children_sorted_subtree_size.begin(), children_sorted_subtree_size.end());

    // Removing subtree costs sorted ascending.
    std::vector<int> children_subtree_deletion_costs;
    // Iterate over all children and sum up the costs.
    int current_child = 0;
    for (std::vector<int>::iterator it=children_sorted_subtree_size.begin(); it!=children_sorted_subtree_size.end(); ++it) {
      current_child = children_subtree_deletion_costs.size();
      if (current_child == 0) {
        children_subtree_deletion_costs.push_back(*it);
      } else {
        children_subtree_deletion_costs.push_back(children_subtree_deletion_costs[current_child-1] + *it);
      }
    }
    ti.postl_to_ordered_child_size_[start_postorder] = children_subtree_deletion_costs;
  }

  // PostLToHeight index
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    height = this_height + 1;
    ti.postl_to_height_[start_postorder] = height;
  }

  // PostLToSize index
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_[start_postorder] = desc_sum + 1;
  }
  
  // PreLToSize index
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_[this_nodes_preorder] = desc_sum + 1;
  }
  
  // PostLToParent index
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    for (const auto& child_id : children_postorders) {
      ti.postl_to_parent_[child_id] = start_postorder;
    }
  }
  
  // PostLToPreL index
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_[start_postorder] = this_nodes_preorder;
  }
  
  // PreLToPostL index
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_[this_nodes_preorder] = start_postorder;
  }
  
  // PreLToPreR index
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_[this_nodes_preorder] = preorder_r;
  }
  
  // PreRToPreL index
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_[preorder_r] = this_nodes_preorder;
  }
  
  // PreLToPostR index
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_[this_nodes_preorder] = postorder_r;
  }
  
  // PostRToPreL index
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_[postorder_r] = this_nodes_preorder;
  }
  
  // PostLToChildren index
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_[start_postorder] = children_postorders;
  }
  
  // PreLToChildren index
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_[this_nodes_preorder] = children_preorders;
  }
  
  // PreLToLabelId index
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_[this_nodes_preorder] = label_id;
  }
  
  // PostLToLabelId index
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_[start_postorder] = label_id;
  }
  
  // PostLToType index
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_[start_postorder] = type;
  }
  
  // InvertedListLabelIdToPostL index
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_[label_id].push_back(start_postorder);
  }
  
  // PostRToLabelId index
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_[postorder_r] = label_id;
  }
  
  // PostLToDepth index
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_[start_postorder] = start_depth;
  }
  
  // InvertedListDepthToPostL index
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.at(start_depth).push_back(start_postorder);
  }

  // PostLToSubtreeMaxDepth index
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    if (n.is_leaf()) {
      // If this node has no children, set the max depth to this node's depth.
      this_subtree_max_depth = start_depth;
    }
    ti.postl_to_subtree_max_depth_[start_postorder] = this_subtree_max_depth;
    // Update parent subtree's max depth.
    subtree_max_depth = std::max(subtree_max_depth, this_subtree_max_depth);
  }
  
  // PostLToHeight index
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    if (n.is_leaf()) {
      // If this node has no children, set the max depth to this node's depth.
      this_height = start_height;
    }
    ti.postl_to_height_[start_postorder] = this_height;
    // Update parent subtree's max depth.
    height = std::max(height, this_height);
  }
  
  // PostLToLCh index
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_[start_postorder] = first_child_postorder;
  }
  
  // PostLToLLD index
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    if (n.is_leaf()) {
      // Set lld of this node to this node's postorer.
      ti.postl_to_lld_[start_postorder] = start_postorder;
    } else {
      // This node's lld must be pushed after its childrens llds.
      // lld is indexed starting with 0, thus first_child_postorder-1.
      ti.postl_to_lld_[start_postorder] = ti.postl_to_lld_[first_child_postorder];
    }
  }

  // PreLToLLD index
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    if (n.is_leaf()) {
      // Set lld of this node to this node's preorder.
      ti.prel_to_lld_[this_nodes_preorder] = this_nodes_preorder;
    } else {
      // Push this node's lld to its first child (this_nodes_preorder + 1).
      ti.prel_to_lld_[this_nodes_preorder] = ti.prel_to_lld_[this_nodes_preorder + 1];
    }
  }

  // PreLToRLD index
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    // RLD of a node n is: pre(n)+size(n)-1; size(n)=desc_sum+1
    ti.prel_to_rld_[this_nodes_preorder] = this_nodes_preorder + desc_sum;
  }

  // PreLToTypeLeft index
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    if (num_children > 0) {
      ti.prel_to_type_left_[children_preorders[0]] = true;
    }
  }

  // PreLToTypeRight index
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    if (num_children > 0) {
      ti.prel_to_type_right_[children_preorders[num_children-1]] = true;
    }
  }

  // PreLToSpfCost indexes
  // TODO: Indexes store long long int, but desc_sum is an
  //       int. Verify if there is no weird conversion.
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    // Add this node's subtree size to this node's sum.
    ti.prel_to_cost_all_[this_nodes_preorder] += desc_sum + 1;
    // If this node has a parent.
    if (parent_preorder != -1) {
      // Update the parent with this node's sum.
      ti.prel_to_cost_all_[parent_preorder] += ti.prel_to_cost_all_[this_nodes_preorder];
      ti.prel_to_cost_left_[parent_preorder] += ti.prel_to_cost_left_[this_nodes_preorder];
      ti.prel_to_cost_right_[parent_preorder] += ti.prel_to_cost_right_[this_nodes_preorder];
      // Check if this node is leftmost child of its parent.
      if (this_nodes_preorder != parent_preorder + 1) {
        ti.prel_to_cost_left_[parent_preorder] += desc_sum + 1;
      }
      // Check if this node is rightmost child of its parent.
      if (!is_rightmost_child) {
        ti.prel_to_cost_right_[parent_preorder] += desc_sum + 1;
      }
    }
    // Calculate the cost and store.
    ti.prel_to_cost_all_[this_nodes_preorder] =
        (desc_sum + 1) * (desc_sum + 1 + 3) / 2 - ti.prel_to_cost_all_[this_nodes_preorder];
    // Add this node's subtree size to this node's sum.
    ti.prel_to_cost_left_[this_nodes_preorder] += desc_sum + 1;
    ti.prel_to_cost_right_[this_nodes_preorder] += desc_sum + 1;
  }

  // PreLToSubtreeCost indexes
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    // Add the cost of this node's subtree.
    ti.prel_to_subtree_del_cost_[this_nodes_preorder] += cm.del(label_id);
    ti.prel_to_subtree_ins_cost_[this_nodes_preorder] += cm.ins(label_id);
    // If this node has a parent.
    if (parent_preorder != -1) {
      // Update the cost of the parent node subtree.
      ti.prel_to_subtree_del_cost_[parent_preorder] += ti.prel_to_subtree_del_cost_[this_nodes_preorder];
      ti.prel_to_subtree_ins_cost_[parent_preorder] += ti.prel_to_subtree_ins_cost_[this_nodes_preorder];
    }
  }

  // Increment start_postorder for the consecutive node in postorder to have the
  // correct id.
  ++start_postorder;

  // Return the number of nodes in the subtree rooted at this node.
  return desc_sum + 1;
  
}